

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_gradient_radial
          (rf_image *__return_storage_ptr__,int width,int height,float density,rf_color inner,
          rf_color outer,rf_allocator allocator)

{
  rf_source_location rVar1;
  undefined1 auVar2 [24];
  rf_color *dst;
  long dst_size;
  uint uStack_4c;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  dst_size = (long)(width * height * 4);
  rVar1.proc_name = "rf_gen_image_gradient_radial";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x421f;
  auVar2._8_8_ = (ulong)uStack_4c << 0x20;
  auVar2._0_8_ = dst_size;
  auVar2._16_8_ = 0;
  dst = (rf_color *)
        (*allocator.allocator_proc)
                  (&allocator,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
  if (dst != (rf_color *)0x0) {
    rf_gen_image_gradient_radial_to_buffer
              (__return_storage_ptr__,width,height,density,inner,outer,dst,dst_size);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_radial(int width, int height, float density, rf_color inner, rf_color outer, rf_allocator allocator)
{
    rf_image result = {0};

    int dst_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
    rf_color* dst = RF_ALLOC(allocator, dst_size);

    if (dst)
    {
        result = rf_gen_image_gradient_radial_to_buffer(width, height, density, inner, outer, dst, dst_size);
    }

    return result;
}